

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_convert.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *format;
  double dVar4;
  double dVar5;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    abort_example("Could not init Allegro.\n");
    iVar2 = __cxa_atexit();
    return iVar2;
  }
  if (argc < 3) {
    log_printf("This example needs to be run from the command line.\n");
    log_printf("Usage: %s <infile> <outfile>\n",*argv);
    format = "\tPossible file types: BMP PCX PNG TGA\n";
  }
  else {
    al_init_image_addon();
    al_set_new_bitmap_format(9);
    al_set_new_bitmap_flags(1);
    lVar3 = al_load_bitmap_flags(argv[1],0x200);
    if (lVar3 == 0) {
      format = "Error loading input file\n";
    }
    else {
      dVar4 = (double)al_get_time();
      cVar1 = al_save_bitmap(argv[2],lVar3);
      if (cVar1 != '\0') {
        dVar5 = (double)al_get_time();
        log_printf("Saving took %.4f seconds\n",dVar5 - dVar4);
        al_destroy_bitmap(lVar3);
        return 0;
      }
      format = "Error saving bitmap\n";
    }
  }
  log_printf(format);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_BITMAP *bitmap;
   double t0;
   double t1;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 3) {
      log_printf("This example needs to be run from the command line.\n");
      log_printf("Usage: %s <infile> <outfile>\n", argv[0]);
      log_printf("\tPossible file types: BMP PCX PNG TGA\n");
      goto done;
   }

   al_init_image_addon();

   al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ARGB_8888);
   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);

   bitmap = al_load_bitmap_flags(argv[1], ALLEGRO_NO_PREMULTIPLIED_ALPHA);
   if (!bitmap) {
      log_printf("Error loading input file\n");
      goto done;
   }

   t0 = al_get_time();
   if (!al_save_bitmap(argv[2], bitmap)) {
      log_printf("Error saving bitmap\n");
      goto done;
   }
   t1 = al_get_time();
   log_printf("Saving took %.4f seconds\n", t1 - t0);

   al_destroy_bitmap(bitmap);

done:
   close_log(true);

   return 0;
}